

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2blob.c
# Opt level: O0

int key2blob_check_selection(int selection,int selection_mask)

{
  int check2;
  int check1;
  size_t i;
  int checks [3];
  int selection_mask_local;
  int selection_local;
  int local_4;
  
  checks[0] = 1;
  checks[1] = 2;
  checks[2] = 0x84;
  if (selection == 0) {
    local_4 = 1;
  }
  else {
    for (i = 0; i < 3; i = i + 1) {
      if ((selection & checks[i]) != 0) {
        return (uint)((selection_mask & checks[i]) != 0);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int key2blob_check_selection(int selection, int selection_mask)
{
    /*
     * The selections are kinda sorta "levels", i.e. each selection given
     * here is assumed to include those following.
     */
    int checks[] = {
        OSSL_KEYMGMT_SELECT_PRIVATE_KEY,
        OSSL_KEYMGMT_SELECT_PUBLIC_KEY,
        OSSL_KEYMGMT_SELECT_ALL_PARAMETERS
    };
    size_t i;

    /* The decoder implementations made here support guessing */
    if (selection == 0)
        return 1;

    for (i = 0; i < OSSL_NELEM(checks); i++) {
        int check1 = (selection & checks[i]) != 0;
        int check2 = (selection_mask & checks[i]) != 0;

        /*
         * If the caller asked for the currently checked bit(s), return
         * whether the decoder description says it's supported.
         */
        if (check1)
            return check2;
    }

    /* This should be dead code, but just to be safe... */
    return 0;
}